

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

GLenum __thiscall irr::video::COpenGLDriver::getZBufferBits(COpenGLDriver *this)

{
  u8 uVar1;
  GLenum bits;
  COpenGLDriver *this_local;
  
  uVar1 = (this->Params).ZBufferBits;
  if (uVar1 == '\x10') {
    bits = 0x81a5;
  }
  else if (uVar1 == '\x18') {
    bits = 0x81a6;
  }
  else if (uVar1 == ' ') {
    bits = 0x81a7;
  }
  else {
    bits = 0x1902;
  }
  return bits;
}

Assistant:

GLenum COpenGLDriver::getZBufferBits() const
{
	GLenum bits = 0;
	switch (Params.ZBufferBits) {
	case 16:
		bits = GL_DEPTH_COMPONENT16;
		break;
	case 24:
		bits = GL_DEPTH_COMPONENT24;
		break;
	case 32:
		bits = GL_DEPTH_COMPONENT32;
		break;
	default:
		bits = GL_DEPTH_COMPONENT;
		break;
	}
	return bits;
}